

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O0

int Aig_ManAddNewCnfToSolver
              (sat_solver *pSat,Aig_Man_t *pAig,Vec_Int_t *vNode2Var,Vec_Int_t *vPioIds,
              Vec_Ptr_t *vPartPos,int fAlignPol)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *pCnf_00;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  bool bVar6;
  int iNodeIdOld;
  int iSatVarOld;
  int Lits [2];
  int i;
  int *pEnd;
  int *pBeg;
  Aig_Obj_t *pObj;
  Cnf_Dat_t *pCnf;
  int fAlignPol_local;
  Vec_Ptr_t *vPartPos_local;
  Vec_Int_t *vPioIds_local;
  Vec_Int_t *vNode2Var_local;
  Aig_Man_t *pAig_local;
  sat_solver *pSat_local;
  
  iVar2 = Aig_ManCoNum(pAig);
  pCnf_00 = Cnf_Derive(pAig,iVar2);
  Cnf_DataTranformPolarity(pCnf_00,1);
  iVar2 = sat_solver_nvars(pSat);
  Cnf_DataLift(pCnf_00,iVar2);
  iVar2 = sat_solver_nvars(pSat);
  sat_solver_setnvars(pSat,iVar2 + pCnf_00->nVars);
  Lits[0] = 0;
  while( true ) {
    bVar6 = false;
    if (Lits[0] < pCnf_00->nClauses) {
      pEnd = pCnf_00->pClauses[Lits[0]];
      bVar6 = false;
      if (pEnd != (int *)0x0) {
        unique0x00012000 = pCnf_00->pClauses[Lits[0] + 1];
        bVar6 = unique0x00012000 != (int *)0x0;
      }
    }
    if (!bVar6) break;
    iVar2 = sat_solver_addclause(pSat,pEnd,stack0xffffffffffffffa8);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                    ,0x18b,
                    "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                   );
    }
    Lits[0] = Lits[0] + 1;
  }
  for (Lits[0] = 0; iVar2 = Lits[0], iVar3 = Vec_PtrSize(pAig->vCis), iVar2 < iVar3;
      Lits[0] = Lits[0] + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,Lits[0]);
    iVar2 = Vec_IntEntry(vPioIds,Lits[0]);
    iVar3 = Vec_IntEntry(vNode2Var,iVar2);
    if (iVar3 == 0) {
      piVar1 = pCnf_00->pVarNums;
      iVar3 = Aig_ObjId(pAVar4);
      Vec_IntWriteEntry(vNode2Var,iVar2,piVar1[iVar3]);
    }
    else {
      iNodeIdOld = toLitCond(iVar3,0);
      piVar1 = pCnf_00->pVarNums;
      iVar2 = Aig_ObjId(pAVar4);
      iSatVarOld = toLitCond(piVar1[iVar2],1);
      iVar2 = sat_solver_addclause(pSat,&iNodeIdOld,Lits);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                      ,0x19d,
                      "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                     );
      }
      iNodeIdOld = toLitCond(iVar3,1);
      piVar1 = pCnf_00->pVarNums;
      iVar2 = Aig_ObjId(pAVar4);
      iSatVarOld = toLitCond(piVar1[iVar2],0);
      iVar2 = sat_solver_addclause(pSat,&iNodeIdOld,Lits);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                      ,0x1a1,
                      "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                     );
      }
    }
  }
  Lits[0] = 0;
  do {
    iVar2 = Lits[0];
    iVar3 = Vec_PtrSize(pAig->vCos);
    if (iVar3 <= iVar2) {
      iVar2 = Vec_IntEntry(vNode2Var,0);
      if (iVar2 == 0) {
        Vec_IntWriteEntry(vNode2Var,0,*pCnf_00->pVarNums);
      }
      Cnf_DataFree(pCnf_00);
      Lits[0] = 0;
      while( true ) {
        iVar2 = Lits[0];
        iVar3 = Vec_PtrSize(vPartPos);
        if (iVar3 <= iVar2) {
          Lits[0] = 0;
          do {
            iVar2 = Lits[0];
            iVar3 = Vec_PtrSize(pAig->vCis);
            if (iVar3 <= iVar2) {
              return 0;
            }
            pvVar5 = Vec_PtrEntry(pAig->vCis,Lits[0]);
            if (((*(ulong *)((long)pvVar5 + 0x18) >> 4 & 1) != 0) ||
               ((*(ulong *)((long)pvVar5 + 0x18) >> 5 & 1) != 0)) {
              iVar2 = Vec_IntEntry(vPioIds,Lits[0]);
              iVar2 = Vec_IntEntry(vNode2Var,iVar2);
              iNodeIdOld = toLitCond(iVar2,(uint)(*(ulong *)((long)pvVar5 + 0x18) >> 4) & 1);
              iVar2 = sat_solver_addclause(pSat,&iNodeIdOld,&iSatVarOld);
              if (iVar2 == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                              ,0x1d8,
                              "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                             );
              }
              *(ulong *)((long)pvVar5 + 0x18) = *(ulong *)((long)pvVar5 + 0x18) & 0xffffffffffffffdf
              ;
              *(ulong *)((long)pvVar5 + 0x18) = *(ulong *)((long)pvVar5 + 0x18) & 0xffffffffffffffef
              ;
            }
            Lits[0] = Lits[0] + 1;
          } while( true );
        }
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vPartPos,Lits[0]);
        iVar2 = Aig_ObjFaninId0(pAVar4);
        iVar2 = Vec_IntEntry(vNode2Var,iVar2);
        if (iVar2 == 0) break;
        iVar3 = Aig_ObjFaninC0(pAVar4);
        iNodeIdOld = toLitCond(iVar2,iVar3);
        if ((fAlignPol != 0) &&
           (pAVar4 = Aig_ObjFanin0(pAVar4), (*(ulong *)&pAVar4->field_0x18 >> 3 & 1) != 0)) {
          iNodeIdOld = lit_neg(iNodeIdOld);
        }
        iVar2 = sat_solver_addclause(pSat,&iNodeIdOld,&iSatVarOld);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                        ,0x1ca,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        Lits[0] = Lits[0] + 1;
      }
      __assert_fail("iSatVarOld != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                    ,0x1c2,
                    "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                   );
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,Lits[0]);
    iVar2 = Aig_ManCiNum(pAig);
    iVar2 = Vec_IntEntry(vPioIds,iVar2 + Lits[0]);
    iVar3 = Vec_IntEntry(vNode2Var,iVar2);
    if (iVar3 == 0) {
      piVar1 = pCnf_00->pVarNums;
      iVar3 = Aig_ObjId(pAVar4);
      Vec_IntWriteEntry(vNode2Var,iVar2,piVar1[iVar3]);
    }
    else {
      iNodeIdOld = toLitCond(iVar3,0);
      piVar1 = pCnf_00->pVarNums;
      iVar2 = Aig_ObjId(pAVar4);
      iSatVarOld = toLitCond(piVar1[iVar2],1);
      iVar2 = sat_solver_addclause(pSat,&iNodeIdOld,Lits);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                      ,0x1b2,
                      "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                     );
      }
      iNodeIdOld = toLitCond(iVar3,1);
      piVar1 = pCnf_00->pVarNums;
      iVar2 = Aig_ObjId(pAVar4);
      iSatVarOld = toLitCond(piVar1[iVar2],0);
      iVar2 = sat_solver_addclause(pSat,&iNodeIdOld,Lits);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                      ,0x1b6,
                      "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                     );
      }
    }
    Lits[0] = Lits[0] + 1;
  } while( true );
}

Assistant:

int Aig_ManAddNewCnfToSolver( sat_solver * pSat, Aig_Man_t * pAig, Vec_Int_t * vNode2Var, 
                             Vec_Int_t * vPioIds, Vec_Ptr_t * vPartPos, int fAlignPol )
{
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int * pBeg, * pEnd;
    int i, Lits[2], iSatVarOld, iNodeIdOld;
    // derive CNF and express it using new SAT variables
    pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    Cnf_DataTranformPolarity( pCnf, 1 );
    Cnf_DataLift( pCnf, sat_solver_nvars(pSat) );
    // create new variables in the SAT solver
    sat_solver_setnvars( pSat, sat_solver_nvars(pSat) + pCnf->nVars );
    // add clauses for this CNF
    Cnf_CnfForClause( pCnf, pBeg, pEnd, i )
        if ( !sat_solver_addclause( pSat, pBeg, pEnd ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
    // derive the connector clauses
    Aig_ManForEachCi( pAig, pObj, i )
    {
        iNodeIdOld = Vec_IntEntry( vPioIds, i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        if ( iSatVarOld == 0 ) // iNodeIdOld in the original AIG has no SAT var
        { 
            // map the corresponding original AIG node into this SAT var
            Vec_IntWriteEntry( vNode2Var, iNodeIdOld, pCnf->pVarNums[Aig_ObjId(pObj)] );
            continue;
        }
        // add connector clauses 
        Lits[0] = toLitCond( iSatVarOld, 0 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( iSatVarOld, 1 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // derive the connector clauses
    Aig_ManForEachCo( pAig, pObj, i )
    {
        iNodeIdOld = Vec_IntEntry( vPioIds, Aig_ManCiNum(pAig) + i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        if ( iSatVarOld == 0 ) // iNodeIdOld in the original AIG has no SAT var
        { 
            // map the corresponding original AIG node into this SAT var
            Vec_IntWriteEntry( vNode2Var, iNodeIdOld, pCnf->pVarNums[Aig_ObjId(pObj)] );
            continue;
        }
        // add connector clauses 
        Lits[0] = toLitCond( iSatVarOld, 0 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( iSatVarOld, 1 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // transfer the ID of constant 1 node
    if ( Vec_IntEntry( vNode2Var, 0 ) == 0 )
        Vec_IntWriteEntry( vNode2Var, 0, pCnf->pVarNums[0] );
    // remove the CNF
    Cnf_DataFree( pCnf );
    // constrain the solver with the literals corresponding to the original POs
    Vec_PtrForEachEntry( Aig_Obj_t *, vPartPos, pObj, i )
    {
        iNodeIdOld = Aig_ObjFaninId0( pObj );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        assert( iSatVarOld != 0 );
        // assert the original PO to be 1
        Lits[0] = toLitCond( iSatVarOld, Aig_ObjFaninC0(pObj) );
        // correct the polarity if polarity alignment is enabled
        if ( fAlignPol && Aig_ObjFanin0(pObj)->fPhase ) 
            Lits[0] = lit_neg( Lits[0] );
        if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
    }
    // constrain some the primary inputs to constant values
    Aig_ManForEachCi( pAig, pObj, i )
    {
        if ( !pObj->fMarkA && !pObj->fMarkB )
            continue;
        iNodeIdOld = Vec_IntEntry( vPioIds, i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        Lits[0] = toLitCond( iSatVarOld, pObj->fMarkA );
        if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
        pObj->fMarkA = pObj->fMarkB = 0;
    }
    return 0;
}